

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  block_type_t bVar1;
  void *pvVar2;
  void *pvVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  gbspace_t gVar8;
  option_t *poVar9;
  size_t sVar10;
  char *pcVar11;
  sourcefile_t *psVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  block_header_t *pbVar16;
  reloc_entry_t *data;
  symbol_entry_t *data_00;
  section_entry_t *psVar17;
  list_t *plVar18;
  list_t *plVar19;
  int *piVar20;
  FILE *pFVar21;
  uchar *__ptr;
  long lVar22;
  long lVar23;
  char *pcVar24;
  list_s *plVar25;
  int *piVar26;
  list_t **pplVar27;
  int iVar28;
  list_s *plVar29;
  int *piVar30;
  int iVar31;
  
  esetprogram("gbld");
  esetonfatal(on_fatal_error);
  parse_options(argc,argv,2,help,version);
  iVar5 = errors();
  iVar31 = 1;
  if (iVar5 == 0) {
    poVar9 = get_option("-o");
    sVar10 = strlen((poVar9->value).str);
    pcVar11 = (char *)mmalloc(sVar10 + 1);
    poVar9 = get_option("-o");
    strcpy(pcVar11,(poVar9->value).str);
    poVar9 = get_option("-g");
    iVar5 = poVar9->set;
    init_rom();
    file_first();
    psVar12 = file_next();
    plVar18 = lsymbols;
    if (psVar12 != (sourcefile_t *)0x0) {
      iVar31 = 0;
      do {
        esetfile(psVar12->name);
        infile = (FILE *)fopen(psVar12->name,"rb");
        if ((FILE *)infile == (FILE *)0x0) {
          ccerr(F,"unable to open \"%s\"",psVar12->name);
        }
        else {
          fseek((FILE *)infile,0,2);
          uVar13 = ftell((FILE *)infile);
          fseek((FILE *)infile,0,0);
          set_infile(infile);
          read_obj_header();
          sVar10 = strlen(psVar12->name);
          pcVar14 = (char *)mmalloc(sVar10 + 1);
          strcpy(pcVar14,psVar12->name);
          list_add(&lfiles,iVar31,pcVar14,0);
          uVar15 = ftell((FILE *)infile);
          while (uVar15 < uVar13) {
            pbVar16 = read_block_header();
            init_map();
            bVar1 = pbVar16->type;
            if (bVar1 == sections) {
              if (0 < pbVar16->num_entries) {
                iVar28 = 0;
                do {
                  psVar17 = read_section_entry();
                  list_add(&lsections,iVar31,psVar17,0);
                  iVar28 = iVar28 + 1;
                } while (iVar28 < pbVar16->num_entries);
              }
            }
            else if (bVar1 == symbols) {
              if (0 < pbVar16->num_entries) {
                iVar28 = 0;
                do {
                  data_00 = read_symbol_entry();
                  list_add(&lsymbols,iVar31,data_00,iVar31);
                  iVar28 = iVar28 + 1;
                } while (iVar28 < pbVar16->num_entries);
              }
            }
            else if ((bVar1 == relocations) && (0 < pbVar16->num_entries)) {
              iVar28 = 0;
              do {
                data = read_reloc_entry();
                list_add(&lrelocations,iVar31,data,0);
                iVar28 = iVar28 + 1;
              } while (iVar28 < pbVar16->num_entries);
            }
            uVar15 = ftell((FILE *)infile);
          }
          fclose((FILE *)infile);
          iVar31 = iVar31 + 1;
        }
        psVar12 = file_next();
        plVar18 = lsymbols;
      } while (psVar12 != (sourcefile_t *)0x0);
    }
    for (; (plVar19 = lsections, plVar18 != (list_t *)0x0 &&
           (plVar29 = plVar18->next, plVar29 != (list_s *)0x0)); plVar18 = plVar18->next) {
      do {
        if ((plVar18->file_id != plVar29->file_id) &&
           ((*(int *)((long)plVar18->data + 0x2c) == 1 &&
            (*(int *)((long)plVar29->data + 0x2c) == 1)))) {
          pcVar14 = (char *)((long)plVar29->data + 4);
          iVar31 = strcmp((char *)((long)plVar18->data + 4),pcVar14);
          if (iVar31 == 0) {
            ccerr(E,"duplicate symbol \'%s\'",pcVar14);
          }
        }
        plVar29 = plVar29->next;
      } while (plVar29 != (list_s *)0x0);
    }
    for (; plVar18 = lsymbols, plVar19 != (list_t *)0x0; plVar19 = plVar19->next) {
      plVar18 = list_at(lfiles,plVar19->file_id);
      psVar17 = (section_entry_t *)plVar19->data;
      esetfile((char *)plVar18->data);
      if (psVar17->type == org) {
        uVar6 = allocate((char *)plVar18->data,psVar17);
        psVar17->offset = uVar6;
        plVar19->flags = 1;
      }
    }
    for (; plVar29 = lsections, plVar19 = lrelocations, plVar18 != (list_t *)0x0;
        plVar18 = plVar18->next) {
      plVar19 = list_at(lfiles,plVar18->file_id);
      plVar29 = lsymbols;
      pvVar2 = plVar18->data;
      if (*(int *)((long)pvVar2 + 0x2c) == 2) {
        esetfile((char *)plVar19->data);
        if (plVar29 != (list_t *)0x0) {
          iVar31 = plVar18->file_id;
          do {
            iVar28 = plVar29->file_id;
            if (((iVar31 != iVar28) && (pvVar3 = plVar29->data, *(int *)((long)pvVar3 + 0x2c) == 1))
               && (iVar7 = strcmp((char *)((long)pvVar2 + 4),(char *)((long)pvVar3 + 4)), iVar7 == 0
                  )) {
              plVar18->flags = iVar28;
              *(undefined8 *)((long)pvVar2 + 0x24) = *(undefined8 *)((long)pvVar3 + 0x24);
              goto LAB_00102908;
            }
            plVar29 = plVar29->next;
          } while (plVar29 != (list_s *)0x0);
        }
        err(E,"symbol \'%s\' unsolved",(long)pvVar2 + 4);
      }
LAB_00102908:
    }
    for (; lsections = plVar29, plVar19 != (list_t *)0x0; plVar19 = plVar19->next) {
      plVar18 = list_at(lfiles,plVar19->file_id);
      plVar29 = lsymbols;
      piVar4 = (int *)plVar19->data;
      esetfile((char *)plVar18->data);
      if (plVar29 != (list_t *)0x0) {
        iVar31 = plVar19->file_id;
        do {
          if ((plVar29->file_id == iVar31) &&
             (piVar26 = (int *)plVar29->data, *plVar29->data == *piVar4)) goto LAB_0010299f;
          plVar29 = plVar29->next;
        } while (plVar29 != (list_s *)0x0);
      }
      err(F,"relocation entries corrupted");
      iVar31 = plVar19->file_id;
      plVar29 = (list_t *)0x0;
      piVar26 = _DAT_00000008;
LAB_0010299f:
      plVar25 = lsections;
      do {
        if ((plVar25->file_id == iVar31) && (piVar20 = (int *)plVar25->data, *piVar20 == piVar4[1]))
        goto LAB_001029c8;
        plVar25 = plVar25->next;
      } while (plVar25 != (list_s *)0x0);
      piVar20 = (int *)0x0;
LAB_001029c8:
      if (piVar26[0xb] == 2) {
        for (plVar25 = lsections;
            (plVar25->file_id != plVar29->flags ||
            (piVar30 = (int *)plVar25->data, *piVar30 != piVar26[9])); plVar25 = plVar25->next) {
        }
      }
      else {
        for (plVar25 = lsections;
            (plVar25->file_id != plVar29->file_id ||
            (piVar30 = (int *)plVar25->data, *piVar30 != piVar26[9])); plVar25 = plVar25->next) {
        }
      }
      iVar31 = piVar26[10] + piVar30[2];
      if (piVar4[3] == 1) {
        uVar6 = ~(piVar20[2] + piVar4[2]);
        *(char *)(*(long *)(piVar20 + 6) + (long)piVar4[2]) = (char)iVar31 + (char)uVar6;
        if ((iVar31 + uVar6) - 0x81 < 0xffffff00) {
          err(E,"relative jump to \'%s\' out of reach",piVar26 + 1);
        }
      }
      else {
        *(char *)(*(long *)(piVar20 + 6) + (long)piVar4[2]) = (char)iVar31;
        *(char *)(*(long *)(piVar20 + 6) + 1 + (long)piVar4[2]) = (char)((uint)iVar31 >> 8);
      }
      plVar29 = lsections;
    }
    while ((plVar29 != (list_t *)0x0 && (iVar31 = errors(), iVar31 == 0))) {
      write_section((section_entry_t *)plVar29->data);
      plVar29 = plVar29->next;
    }
    iVar31 = errors();
    if (iVar31 == 0) {
      pFVar21 = fopen(pcVar11,"wb");
      if (pFVar21 == (FILE *)0x0) {
        ccerr(F,"unable to open \"%s\"",pcVar11);
      }
      fix_rom();
      iVar31 = get_num_rom_banks();
      if (0 < iVar31) {
        iVar31 = 0;
        do {
          __ptr = get_rom_bank(iVar31);
          fwrite(__ptr,0x4000,1,pFVar21);
          iVar31 = iVar31 + 1;
          iVar28 = get_num_rom_banks();
        } while (iVar31 < iVar28);
      }
      fclose(pFVar21);
    }
    iVar31 = 0;
    iVar28 = errors();
    if ((iVar28 == 0) && (iVar5 != 0)) {
      lVar22 = -2;
      do {
        lVar23 = lVar22 + 2;
        lVar22 = lVar22 + 1;
      } while (pcVar11[lVar23] != '\0');
      if (lVar22 != -1) {
        do {
          lVar23 = lVar22;
          if (pcVar11[lVar23] == '.') break;
          lVar22 = lVar23 + -1;
        } while (lVar23 != 0);
        if (pcVar11[lVar23] == '.') {
          pcVar11[lVar23] = '\0';
        }
      }
      sVar10 = strlen(pcVar11);
      pcVar14 = (char *)mrealloc(pcVar11,sVar10 + 4);
      pcVar11 = pcVar14;
      do {
        pcVar24 = pcVar11;
        pcVar11 = pcVar24 + 1;
      } while (*pcVar24 != '\0');
      builtin_strncpy(pcVar24,".sym",4);
      plVar29 = lsymbols;
      pFVar21 = fopen(pcVar14,"w");
      if (pFVar21 == (FILE *)0x0) {
        ccerr(F,"unable to open \"%s\"",pcVar14);
      }
      while ((plVar29 != (list_t *)0x0 && (iVar5 = errors(), iVar5 == 0))) {
        pvVar2 = plVar29->data;
        if (*(int *)((long)pvVar2 + 0x2c) != 2) {
          pplVar27 = &lsections;
          while ((plVar18 = *pplVar27, plVar18->file_id != plVar29->file_id ||
                 (piVar4 = (int *)plVar18->data, *piVar4 != *(int *)((long)pvVar2 + 0x24)))) {
            pplVar27 = &plVar18->next;
          }
          gVar8 = get_space(piVar4[2]);
          fprintf(pFVar21,"%02X:%04X %s\n",(ulong)((uint)(gVar8 == rom_n) + piVar4[3]),
                  (ulong)(uint)(*(int *)((long)pvVar2 + 0x28) + piVar4[2]),(long)pvVar2 + 4);
        }
        plVar29 = plVar29->next;
      }
      fclose(pFVar21);
    }
    free_rom();
    free_map();
    list_free(lfiles);
    list_free(lsections);
    list_free(lsymbols);
    list_free(lrelocations);
  }
  return iVar31;
}

Assistant:

int main(int argc, char** argv)
{
    int i, file_id = 0;
    unsigned numsect = 0, numsyms = 0, numrelocs = 0;
    list_t* list;
    sourcefile_t* file = NULL;
    char* output_name = NULL;
    FILE* outfile = NULL;
    list_t* psyms1, * psyms2;
    int gen_debug = 0;


    esetprogram(pgm);
    esetonfatal(&on_fatal_error);

    parse_options(argc, argv, GBLD, &help, &version);

    if (errors())
        return EXIT_FAILURE;

    output_name = (char*)mmalloc(strlen(get_option("-o")->value.str) + 1);
    strcpy(output_name, get_option("-o")->value.str);

    gen_debug = get_option("-g")->set;

    init_rom();

    file_first();
    while ((file = file_next()))
    {
        size_t fsize;
        char* filename;
        esetfile(file->name);
        if (! (infile = fopen(file->name, "rb")))
        {
            ccerr(F, "unable to open \"%s\"", file->name);
            continue;
        }

        fseek(infile, 0, SEEK_END);
        fsize = ftell(infile);
        fseek(infile, 0, SEEK_SET);

        set_infile(infile);
        read_obj_header();

        filename = (char*)mmalloc(strlen(file->name) + 1);
        strcpy(filename, file->name);
        list_add(&lfiles, file_id, filename, 0);

        while (ftell(infile) < fsize)
        {
            block_header_t* header= read_block_header();
            init_map();

            if (header->type == sections)
            {
                section_entry_t* sect;
#ifndef NDEBUG
                printf("New sections block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    unsigned k;
                    sect = read_section_entry();
                    list_add(&lsections, file_id, sect, 0);
                    ++numsect;
#ifndef NDEBUG
                    printf("  * Section %d\n", sect->id);
                    printf("    - Type:      %s\n", sect->type == org ? ".org" : "");
                    printf("    - Offset:    %04x\n", sect->offset);
                    printf("    - Bank:      %d\n", sect->bank_num);
                    printf("    - Data size: %d\n", sect->data_size);
                    for (k = 0; k < sect->data_size; ++k)
                    {
                        if (k && (k % 16) == 0)
                            printf("\n");
                        else if (k && (k % 8) == 0)
                            printf(" ");
                        printf("%02X ", sect->data[k]);

                    }
                    printf("\n");
#endif
                }
            }
            else if (header->type == symbols)
            {
                symbol_entry_t* sym;
#ifndef NDEBUG
                printf("New symbols block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    sym = read_symbol_entry();
                    list_add(&lsymbols, file_id, sym, file_id);
                    ++numsyms;
#ifndef NDEBUG
                    printf("  * Symbol %d\n", sym->sym_id);
                    printf("    - ID:         %s\n", sym->id);
                    printf("    - In section: %d\n", sym->section_id);
                    printf("    - Offset:     %d\n", sym->offset);
                    printf("    - Type:       %c\n", ".GE"[sym->type]);
                    printf("\n");
#endif
                }
            }
            else if (header->type == relocations)
            {
                reloc_entry_t* reloc;
#ifndef NDEBUG
                printf("New relocations block with %d entries\n", header->num_entries);
#endif
                for (i = 0; i < header->num_entries; ++i)
                {
                    reloc = read_reloc_entry();
                    ++numrelocs;
                    list_add(&lrelocations, file_id, reloc, 0);
#ifndef NDEBUG
                    printf("  * Relocation\n");
                    printf("    - Symbol: %d\n", reloc->sym_id);
                    printf("    - Section: %d\n", reloc->section_id);
                    printf("    - Offset: %d\n", reloc->offset);
#endif
                }
            }
        }

        fclose(infile);
        ++file_id;
    }

    /* Search for duplicate global symbols */
    psyms1 = lsymbols;
    while (psyms1)
    {
        psyms2 = psyms1->next;
        while (psyms2)
        {
            if (psyms1->file_id == psyms2->file_id)
            {
                psyms2 = psyms2->next;
                continue;
            }
            if (((symbol_entry_t*)(psyms1->data))->type != _global
                || ((symbol_entry_t*)(psyms2->data))->type != _global)
            {
                psyms2 = psyms2->next;
                continue;
            }
            if (strcmp((const char*)((symbol_entry_t*)(psyms1->data))->id,
                       (const char*)((symbol_entry_t*)(psyms2->data))->id)
                == 0)
            {
                ccerr(E, "duplicate symbol '%s'",
                    ((symbol_entry_t*)(psyms2->data))->id);
            }

            psyms2 = psyms2->next;
        }
        psyms1 = psyms1->next;
    }

    /* .org allocation */
    list = lsections;
    while (list)
    {
        list_t* sfile = list_at(lfiles, list->file_id);
        section_entry_t* sect = (section_entry_t*)list->data;
        esetfile(sfile->data);

        if (sect->type != org)
        {
            list = list->next;
            continue;
        }

        sect->offset = allocate(sfile->data, sect);
        list->flags = SECT_TREATED;

        list = list->next;
    }

    TODO("rom/ram/wram/vram + offset");
    TODO("rom/ram/wram/vram");

    /* link extern symbols */
    list = lsymbols;
    while(list)
    {
        list_t* sfile = list_at(lfiles, list->file_id);
        symbol_entry_t* sym = (symbol_entry_t*)(list->data);
        list_t* tsyms = lsymbols; /* target symbols list */
        symbol_entry_t* tsym;     /* target symbol */

        if (sym->type != _extern)
        {
            list = list->next;
            continue;
        }

        esetfile((char*)sfile->data);
        while (tsyms)
        {
            tsym = (symbol_entry_t*)(tsyms->data);
            if (list->file_id == tsyms->file_id || tsym->type != _global)
            {
                tsyms = tsyms->next;
                continue;
            }

            if (strcmp((char*)sym->id, (char*)tsym->id) == 0)
                break;

            tsyms = tsyms->next;
        }

        if (tsyms == NULL)
            err(E, "symbol '%s' unsolved", sym->id);
        else
        {
            list->flags = tsyms->file_id; /* flag = target file id */
            sym->section_id = tsym->section_id;
            sym->offset = tsym->offset;
        }

        list = list->next;
    }

    /* relocs */
    list = lrelocations;
    while (list)
    {
        list_t* lfile = list_at(lfiles, list->file_id);
        reloc_entry_t* reloc = (reloc_entry_t*)(list->data);
        list_t* target_syms = lsymbols;
        symbol_entry_t* target_sym;
        section_entry_t* reloc_sect;
        section_entry_t* symbol_sect;
        int target_addr;

        esetfile((char*)lfile->data);

        /* search for target symbol among symbols created in the same file */
        while (target_syms)
        {
            if (target_syms->file_id != list->file_id)
            {
                target_syms = target_syms->next;
                continue;
            }
            if (((symbol_entry_t*)(target_syms->data))->sym_id == reloc->sym_id)
                break;
            target_syms = target_syms->next;
        }

        if (target_syms == NULL)
            err(F, "relocation entries corrupted");

        target_sym = (symbol_entry_t*)(target_syms->data);
        reloc_sect = get_section(list->file_id, reloc->section_id);
        if (target_sym->type == _extern)
            symbol_sect = get_section(target_syms->flags, target_sym->section_id);
        else
            symbol_sect = get_section(target_syms->file_id, target_sym->section_id);


        target_addr = symbol_sect->offset + target_sym->offset;
        if (reloc->flags == relative)
        {
            int jr = target_addr - (reloc_sect->offset + reloc->offset + 1);
            reloc_sect->data[reloc->offset] = jr;
            if (jr > 128 || jr < -127)
                err(E, "relative jump to '%s' out of reach", target_sym->id);
        }
        else
        {
            reloc_sect->data[reloc->offset] = target_addr & 0xFF;
            reloc_sect->data[reloc->offset + 1] = (target_addr >> 8) & 0xFF;
        }

        list = list->next;
    }

    /* Write sections to rom banks */
    list = lsections;
    while (list && !errors())
    {
        write_section((section_entry_t*)(list->data));
        list = list->next;
    }

    if (!errors())
    {
        if ( ! (outfile = fopen(output_name, "wb")) )
            ccerr(F, "unable to open \"%s\"", output_name);

        fix_rom();
        for (i = 0; i < get_num_rom_banks(); ++i)
            fwrite(get_rom_bank(i), ROM_BANK_SIZE, 1, outfile);
        fclose(outfile);
    }

    /* Write sym file */
    if (!errors() && gen_debug)
    {
        symbol_entry_t* syms;
        section_entry_t* sect;
        int bank_num;
        char* p = output_name;

        while (*p)
            ++p;
        while (*p != '.' && p != output_name)
            --p;
        if (*p == '.')
            *p = 0;
        output_name = (char*)mrealloc(output_name, strlen(output_name) + 4);
        p = output_name;
        while (*p != 0)
            ++p;
        *p++ = '.';
        *p++ = 's';
        *p++ = 'y';
        *p++ = 'm';
        list = lsymbols;

        if ( ! (outfile = fopen(output_name, "w")) )
            ccerr(F, "unable to open \"%s\"", output_name);

        while (list && !errors())
        {
            syms = (symbol_entry_t*)(list->data);
            if (syms->type != _extern)
            {
                sect = get_section(list->file_id, syms->section_id);
                if (get_space(sect->offset) == rom_n)
                    bank_num = sect->bank_num + 1;
                else
                    bank_num = sect->bank_num;
                fprintf(outfile, "%02X:%04X %s\n", bank_num,
                       sect->offset + syms->offset, syms->id);
            }
            list = list->next;
        }

        fclose(outfile);
    }

    free_rom();
    free_map();
    list_free(lfiles);
    list_free(lsections);
    list_free(lsymbols);
    list_free(lrelocations);

    return EXIT_SUCCESS;
}